

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

void fsnav_linal_quat2mat(double *R,double *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = q[3];
  dVar3 = q[1];
  dVar4 = q[2];
  dVar5 = dVar1 + dVar1;
  dVar6 = dVar3 + dVar3;
  dVar2 = *q;
  dVar7 = dVar4 * 2.0;
  *R = (1.0 - dVar7 * dVar4) - dVar1 * dVar5;
  R[1] = dVar4 * dVar6 + dVar5 * dVar2;
  R[2] = dVar3 * dVar5 - dVar7 * dVar2;
  R[3] = dVar4 * dVar6 - dVar5 * dVar2;
  R[4] = (1.0 - dVar1 * dVar5) - dVar6 * dVar3;
  R[5] = dVar1 * dVar7 + dVar2 * dVar6;
  R[6] = dVar3 * dVar5 + dVar7 * dVar2;
  R[7] = dVar1 * dVar7 - dVar2 * dVar6;
  R[8] = (1.0 - dVar6 * dVar3) - dVar7 * dVar4;
  return;
}

Assistant:

void fsnav_linal_quat2mat(double* R, double* q)
{
	double q11, q22, q33, q10, q20, q30, q12, q23, q31;

	q11 = 2*q[1]*q[1];
	q22 = 2*q[2]*q[2];
	q33 = 2*q[3]*q[3];

	q10 = 2*q[1]*q[0];
	q20 = 2*q[2]*q[0];
	q30 = 2*q[3]*q[0];

	q12 = 2*q[1]*q[2];
	q23 = 2*q[2]*q[3];
	q31 = 2*q[3]*q[1];

	R[0] = 1 - q22 - q33; R[1] =     q12 + q30; R[2] =     q31 - q20;
	R[3] =     q12 - q30; R[4] = 1 - q33 - q11; R[5] =     q23 + q10;
	R[6] =     q31 + q20; R[7] =     q23 - q10; R[8] = 1 - q11 - q22;
}